

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_word_follows
          (basic_substring<const_char> *this,size_t pos,csubstr word)

{
  ulong uVar1;
  byte bVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  error_flags eVar6;
  ulong sz;
  ulong uVar7;
  size_t len_;
  basic_substring<const_char> bVar8;
  basic_substring<const_char> local_50;
  basic_substring<const_char> local_40;
  
  sz = word.len;
  uVar1 = sz + pos;
  uVar7 = this->len;
  if (uVar1 <= uVar7) {
    if (uVar7 < pos) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        bVar8 = (basic_substring<const_char>)(*pcVar3)();
        return bVar8;
      }
      handle_error(0x24bbea,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x153a,"first >= 0 && first <= len");
    }
    if (sz != 0xffffffffffffffff && uVar7 < sz) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        bVar8 = (basic_substring<const_char>)(*pcVar3)();
        return bVar8;
      }
      handle_error(0x24bbea,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
    }
    len_ = uVar7 - pos;
    if (sz != 0xffffffffffffffff) {
      len_ = sz;
    }
    if ((sz != 0) && (uVar7 < pos + len_)) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
        pcVar3 = (code *)swi(3);
        bVar8 = (basic_substring<const_char>)(*pcVar3)();
        return bVar8;
      }
      handle_error(0x24bbea,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
    }
    basic_substring(&local_50,this->str + pos,len_);
    local_40.str = local_50.str;
    local_40.len = local_50.len;
    iVar5 = compare(&local_40,word.str,sz);
    if (iVar5 == 0) {
      uVar7 = this->len;
      if (uVar7 != uVar1) {
        bVar2 = this->str[uVar1];
        if ((((0x3b < (ulong)bVar2) || ((0x800120100002601U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) &&
            (bVar2 != 0x7d)) && (bVar2 != 0x5d)) goto LAB_001de762;
      }
      if (uVar1 != 0xffffffffffffffff && uVar7 < uVar1) {
        eVar6 = get_error_flags();
        if (((eVar6 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
          pcVar3 = (code *)swi(3);
          bVar8 = (basic_substring<const_char>)(*pcVar3)();
          return bVar8;
        }
        handle_error(0x24bbea,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x154e,"num <= len || num == npos");
      }
      if (uVar1 != 0xffffffffffffffff) {
        uVar7 = uVar1;
      }
      basic_substring(&local_50,this->str,uVar7);
      goto LAB_001de767;
    }
  }
LAB_001de762:
  local_50.str = this->str;
  local_50.len = 0;
LAB_001de767:
  bVar8.len = local_50.len;
  bVar8.str = local_50.str;
  return bVar8;
}

Assistant:

C4_NO_INLINE C4_PURE basic_substring _word_follows(size_t pos, csubstr word) const noexcept
    {
        size_t posend = pos + word.len;
        if(len >= posend && sub(pos, word.len) == word)
            if(len == posend || _is_delim_char(str[posend]))
                return first(posend);
        return first(0);
    }